

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O2

void __thiscall kj::Thread::Thread(Thread *this,Function<void_()> *func)

{
  int osErrorNumber;
  ThreadState *this_00;
  Fault f;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_28;
  
  this_00 = (ThreadState *)operator_new(0x1c0);
  local_28.disposer = (func->impl).disposer;
  local_28.ptr = (func->impl).ptr;
  (func->impl).ptr = (Iface *)0x0;
  ThreadState::ThreadState(this_00,(Function<void_()> *)&local_28);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_28);
  this->state = this_00;
  this->detached = false;
  osErrorNumber = pthread_create(&this->threadId,(pthread_attr_t *)0x0,runThread,this_00);
  if (osErrorNumber == 0) {
    return;
  }
  ThreadState::unref(this->state);
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
             ,0x59,osErrorNumber,"pthread_create","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

Thread::Thread(Function<void()> func): state(new ThreadState(kj::mv(func))) {
  static_assert(sizeof(threadId) >= sizeof(pthread_t),
                "pthread_t is larger than a long long on your platform.  Please port.");

  int pthreadResult = pthread_create(reinterpret_cast<pthread_t*>(&threadId),
                                     nullptr, &runThread, state);
  if (pthreadResult != 0) {
    state->unref();
    KJ_FAIL_SYSCALL("pthread_create", pthreadResult);
  }
}